

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1d85b2b::av1_inv_txfm1d_round_trip_Test::TestBody
          (av1_inv_txfm1d_round_trip_Test *this)

{
  undefined8 *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  SEARCH_METHODS *pSVar10;
  long lVar11;
  int txfm_size;
  int node_err;
  int max_error;
  ACMRandom rnd;
  int32_t input [64];
  int32_t round_trip_output [64];
  int32_t output [64];
  uint local_39c;
  Message local_398;
  AssertHelper local_390;
  internal local_388 [8];
  undefined8 *local_380;
  uint local_378;
  int local_374;
  int local_370 [2];
  long local_368;
  undefined **local_360;
  undefined **local_358;
  code *local_350;
  code *local_348;
  Random local_33c;
  int local_338 [64];
  int local_238 [64];
  undefined1 local_138 [264];
  
  local_33c.state_ = 0xbaba;
  local_368 = 0;
  do {
    local_39c = (&(anonymous_namespace)::txfm_size_ls)[local_368];
    this = (av1_inv_txfm1d_round_trip_Test *)CONCAT71((int7)((ulong)this >> 8),1);
    local_360 = &(anonymous_namespace)::fwd_txfm_func_ls + local_368 * 2;
    local_358 = &(anonymous_namespace)::inv_txfm_func_ls + local_368 * 2;
    lVar11 = 0;
    do {
      local_378 = (uint)this;
      local_348 = (code *)local_360[lVar11];
      local_350 = (code *)local_358[lVar11];
      local_370[1] = 2;
      if (local_348 != (code *)0x0) {
        iVar4 = 0;
        do {
          local_398.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = 0x40;
          testing::internal::CmpHelperLE<int,int>
                    (local_388,"txfm_size","(int)(sizeof(input) / sizeof(input[0]))",
                     (int *)&local_39c,(int *)&local_398);
          puVar1 = local_380;
          if (local_388[0] == (internal)0x0) {
            testing::Message::Message(&local_398);
            if (local_380 == (undefined8 *)0x0) {
              pSVar10 = "";
            }
            else {
              pSVar10 = (SEARCH_METHODS *)*local_380;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_390,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_inv_txfm1d_test.cc"
                       ,0x89,(char *)pSVar10);
            testing::internal::AssertHelper::operator=(&local_390,&local_398);
            testing::internal::AssertHelper::~AssertHelper(&local_390);
            if ((long *)CONCAT44(local_398.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_,
                                 local_398.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_398.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._4_4_,
                                             local_398.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_4_) + 8))();
            }
            if (local_380 == (undefined8 *)0x0) {
              return;
            }
            if ((undefined8 *)*local_380 != local_380 + 2) {
              operator_delete((undefined8 *)*local_380);
            }
            operator_delete(local_380);
            return;
          }
          local_374 = iVar4;
          if (local_380 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_380 != local_380 + 2) {
              operator_delete((undefined8 *)*local_380);
            }
            operator_delete(puVar1);
          }
          if (0 < (int)local_39c) {
            lVar11 = 0;
            do {
              uVar2 = testing::internal::Random::Generate(&local_33c,0x80000000);
              uVar3 = testing::internal::Random::Generate(&local_33c,0x80000000);
              local_338[lVar11] = (uVar2 >> 0xf & 0x3ff) - (uVar3 >> 0xf & 0x3ff);
              lVar11 = lVar11 + 1;
            } while (lVar11 < (int)local_39c);
          }
          (*local_348)(local_338,local_138,0xd,(anonymous_namespace)::range_bit);
          (*local_350)(local_138,local_238,0xd,(anonymous_namespace)::range_bit);
          uVar8 = (ulong)local_39c;
          if (0 < (int)local_39c) {
            lVar11 = 0;
            do {
              uVar9 = uVar8 & 0xffffffff;
              bVar6 = 0xfd;
              do {
                bVar5 = bVar6;
                uVar9 = (ulong)(uint)((int)uVar9 >> 1);
                bVar6 = bVar5 + 1;
                uVar7 = (uint)uVar8;
                uVar8 = uVar9;
              } while (1 < uVar7);
              iVar4 = local_338[lVar11] -
                      (int)((1L << (bVar6 & 0x3f)) + (long)local_238[lVar11] >> (bVar5 + 2 & 0x3f));
              local_370[0] = -iVar4;
              if (0 < iVar4) {
                local_370[0] = iVar4;
              }
              testing::internal::CmpHelperLE<int,int>
                        (local_388,"node_err","max_error",local_370,local_370 + 1);
              if (local_388[0] == (internal)0x0) {
                testing::Message::Message(&local_398);
                pSVar10 = "";
                if (local_380 != (undefined8 *)0x0) {
                  pSVar10 = (SEARCH_METHODS *)*local_380;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_390,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_inv_txfm1d_test.cc"
                           ,0x96,(char *)pSVar10);
                testing::internal::AssertHelper::operator=(&local_390,&local_398);
                testing::internal::AssertHelper::~AssertHelper(&local_390);
                if ((long *)CONCAT44(local_398.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_398.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_398.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._4_4_,
                                                 local_398.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._0_4_) + 8))();
                }
              }
              puVar1 = local_380;
              if (local_380 != (undefined8 *)0x0) {
                if ((undefined8 *)*local_380 != local_380 + 2) {
                  operator_delete((undefined8 *)*local_380);
                }
                operator_delete(puVar1);
              }
              lVar11 = lVar11 + 1;
              uVar8 = (ulong)(int)local_39c;
            } while (lVar11 < (long)uVar8);
          }
          iVar4 = local_374 + 1;
        } while (iVar4 != 5000);
      }
      lVar11 = 1;
      this = (av1_inv_txfm1d_round_trip_Test *)0x0;
    } while ((local_378 & 1) != 0);
    local_368 = local_368 + 1;
    if (local_368 == 5) {
      return;
    }
  } while( true );
}

Assistant:

TEST(av1_inv_txfm1d, round_trip) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  for (int si = 0; si < NELEMENTS(fwd_txfm_func_ls); ++si) {
    int txfm_size = txfm_size_ls[si];

    for (int ti = 0; ti < txfm_type_num; ++ti) {
      TxfmFunc fwd_txfm_func = fwd_txfm_func_ls[si][ti];
      TxfmFunc inv_txfm_func = inv_txfm_func_ls[si][ti];
      int max_error = 2;

      if (!fwd_txfm_func) continue;

      const int count_test_block = 5000;
      for (int i = 0; i < count_test_block; ++i) {
        int32_t input[64];
        int32_t output[64];
        int32_t round_trip_output[64];

        ASSERT_LE(txfm_size, NELEMENTS(input));

        for (int ni = 0; ni < txfm_size; ++ni) {
          input[ni] = rnd.Rand16() % input_base - rnd.Rand16() % input_base;
        }

        fwd_txfm_func(input, output, cos_bit, range_bit);
        inv_txfm_func(output, round_trip_output, cos_bit, range_bit);

        for (int ni = 0; ni < txfm_size; ++ni) {
          int node_err =
              abs(input[ni] - round_shift(round_trip_output[ni],
                                          get_max_bit(txfm_size) - 1));
          EXPECT_LE(node_err, max_error);
        }
      }
    }
  }
}